

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

VkResult __thiscall
VmaAllocator_T::CreatePool(VmaAllocator_T *this,VmaPoolCreateInfo *pCreateInfo,VmaPool *pPool)

{
  uint32_t uVar1;
  ItemType *item;
  VkResult VVar2;
  VkDeviceSize preferredBlockSize;
  VmaPool_T *this_00;
  VmaMutexLockWrite lock;
  VmaPoolCreateInfo newCreateInfo;
  
  newCreateInfo.memoryTypeIndex = pCreateInfo->memoryTypeIndex;
  newCreateInfo.flags = pCreateInfo->flags;
  newCreateInfo.blockSize = pCreateInfo->blockSize;
  newCreateInfo.minBlockCount = pCreateInfo->minBlockCount;
  newCreateInfo.priority = pCreateInfo->priority;
  newCreateInfo._36_4_ = *(undefined4 *)&pCreateInfo->field_0x24;
  newCreateInfo.minAllocationAlignment = pCreateInfo->minAllocationAlignment;
  newCreateInfo.pMemoryAllocateNext = pCreateInfo->pMemoryAllocateNext;
  newCreateInfo.maxBlockCount =
       -(ulong)(pCreateInfo->maxBlockCount == 0) | pCreateInfo->maxBlockCount;
  if (newCreateInfo.maxBlockCount < newCreateInfo.minBlockCount) {
    VVar2 = VK_ERROR_INITIALIZATION_FAILED;
  }
  else {
    VVar2 = VK_ERROR_FEATURE_NOT_PRESENT;
    if ((pCreateInfo->memoryTypeIndex < (this->m_MemProps).memoryTypeCount) &&
       ((this->m_GlobalMemoryTypeBits >> (pCreateInfo->memoryTypeIndex & 0x1f) & 1) != 0)) {
      preferredBlockSize = CalcPreferredBlockSize(this,newCreateInfo.memoryTypeIndex);
      this_00 = (VmaPool_T *)VmaMalloc(&this->m_AllocationCallbacks,0x130,8);
      VmaPool_T::VmaPool_T(this_00,this,&newCreateInfo,preferredBlockSize);
      *pPool = this_00;
      VVar2 = VmaBlockVector::CreateMinBlocks((VmaBlockVector *)this_00);
      if (VVar2 == VK_SUCCESS) {
        lock.m_pMutex = (VmaRWMutex *)0x0;
        if (this->m_UseMutex != false) {
          lock.m_pMutex = &this->m_PoolsMutex;
        }
        if (this->m_UseMutex == true) {
          std::__shared_mutex_pthread::lock((__shared_mutex_pthread *)&this->m_PoolsMutex);
        }
        item = *pPool;
        uVar1 = this->m_NextPoolId;
        this->m_NextPoolId = uVar1 + 1;
        item->m_Id = uVar1;
        VmaIntrusiveLinkedList<VmaPoolListItemTraits>::PushBack(&this->m_Pools,item);
        VmaMutexLockWrite::~VmaMutexLockWrite(&lock);
        VVar2 = VK_SUCCESS;
      }
      else {
        vma_delete<VmaPool_T>(this,*pPool);
        *pPool = (VmaPool)0x0;
      }
    }
  }
  return VVar2;
}

Assistant:

VkResult VmaAllocator_T::CreatePool(const VmaPoolCreateInfo* pCreateInfo, VmaPool* pPool)
{
    VMA_DEBUG_LOG("  CreatePool: MemoryTypeIndex=%u, flags=%u", pCreateInfo->memoryTypeIndex, pCreateInfo->flags);

    VmaPoolCreateInfo newCreateInfo = *pCreateInfo;

    // Protection against uninitialized new structure member. If garbage data are left there, this pointer dereference would crash.
    if(pCreateInfo->pMemoryAllocateNext)
    {
        VMA_ASSERT(((const VkBaseInStructure*)pCreateInfo->pMemoryAllocateNext)->sType != 0);
    }

    if(newCreateInfo.maxBlockCount == 0)
    {
        newCreateInfo.maxBlockCount = SIZE_MAX;
    }
    if(newCreateInfo.minBlockCount > newCreateInfo.maxBlockCount)
    {
        return VK_ERROR_INITIALIZATION_FAILED;
    }
    // Memory type index out of range or forbidden.
    if(pCreateInfo->memoryTypeIndex >= GetMemoryTypeCount() ||
        ((1u << pCreateInfo->memoryTypeIndex) & m_GlobalMemoryTypeBits) == 0)
    {
        return VK_ERROR_FEATURE_NOT_PRESENT;
    }
    if(newCreateInfo.minAllocationAlignment > 0)
    {
        VMA_ASSERT(VmaIsPow2(newCreateInfo.minAllocationAlignment));
    }

    const VkDeviceSize preferredBlockSize = CalcPreferredBlockSize(newCreateInfo.memoryTypeIndex);

    *pPool = vma_new(this, VmaPool_T)(this, newCreateInfo, preferredBlockSize);

    VkResult res = (*pPool)->m_BlockVector.CreateMinBlocks();
    if(res != VK_SUCCESS)
    {
        vma_delete(this, *pPool);
        *pPool = VMA_NULL;
        return res;
    }

    // Add to m_Pools.
    {
        VmaMutexLockWrite lock(m_PoolsMutex, m_UseMutex);
        (*pPool)->SetId(m_NextPoolId++);
        m_Pools.PushBack(*pPool);
    }

    return VK_SUCCESS;
}